

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O1

char * upack_str(char **buf)

{
  char *__dest;
  uint uVar1;
  ulong __n;
  
  uVar1 = *(uint *)*buf;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  __n = (ulong)uVar1;
  *buf = (char *)((long)*buf + 4);
  if (uVar1 == 0) {
    __dest = (char *)emalloc(1);
    *__dest = '\0';
  }
  else {
    __dest = (char *)emalloc(__n + 1);
    memcpy(__dest,*buf,__n);
    __dest[__n] = '\0';
    *buf = *buf + __n;
  }
  return __dest;
}

Assistant:

static char *upack_str(char **buf)
{
    char *val;
    size_t strsz;

    strsz = (size_t) upack_int(buf);

    if(strsz > 0)
    {
        val = (char *)emalloc(strsz + 1);
        memcpy(val, *buf, strsz);
        val[strsz] = 0;
        *buf += strsz;
    }
    else
    {
        val = (char *)emalloc(1);
        *val = 0;
    }

    return val;
}